

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPPacketBuilder::BuildNextPacket(RTCPPacketBuilder *this,RTCPCompoundPacket **pack)

{
  uint32_t senderssrc;
  uint32_t uVar1;
  uint32_t packetcount;
  int iVar2;
  RTPMemoryManager *pRVar3;
  RTCPCompoundPacketBuilder *this_00;
  RTPSourceData *this_01;
  double dVar4;
  bool local_b5;
  int local_b4;
  bool atendoflist_2;
  int skipped_1;
  int added_1;
  bool local_a2;
  bool full_1;
  int itemcount_1;
  bool local_9b;
  bool processedall_1;
  bool atendoflist_1;
  int itemcount;
  bool processedall;
  bool atendoflist;
  int iStack_94;
  bool full;
  int skipped;
  int added;
  size_t owncnamelen;
  uint8_t *owncname;
  RTPNTPTime ntptimestamp;
  uint32_t rtptimestamp;
  uint32_t tsdiff;
  RTPTime diff;
  uint32_t octetcount;
  uint32_t packcount;
  uint32_t rtppacktimestamp;
  RTPTime rtppacktime;
  RTPTime curtime;
  uint32_t ssrc;
  RTPSourceData *srcdat;
  bool sender;
  int status;
  RTCPCompoundPacketBuilder *rtcpcomppack;
  RTCPCompoundPacket **pack_local;
  RTCPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x32;
  }
  else {
    srcdat._3_1_ = false;
    *pack = (RTCPCompoundPacket *)0x0;
    pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    this_00 = (RTCPCompoundPacketBuilder *)operator_new(0x130,pRVar3,0x11);
    pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(this_00,pRVar3);
    if (this_00 == (RTCPCompoundPacketBuilder *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = RTCPCompoundPacketBuilder::InitBuild(this_00,this->maxpacketsize);
      if (this_local._4_4_ < 0) {
        pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
      }
      else {
        this_01 = RTPSources::GetOwnSourceInfo(this->sources);
        if (this_01 != (RTPSourceData *)0x0) {
          srcdat._3_1_ = RTPSourceData::IsSender(this_01);
        }
        senderssrc = RTPPacketBuilder::GetSSRC(this->rtppacketbuilder);
        rtppacktime = RTPTime::CurrentTime();
        if (srcdat._3_1_ == false) {
          iVar2 = RTCPCompoundPacketBuilder::StartReceiverReport(this_00,senderssrc);
          if (iVar2 < 0) {
            pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            if (iVar2 != -0x2b) {
              return iVar2;
            }
            return -0x33;
          }
        }
        else {
          _packcount = RTPPacketBuilder::GetPacketTime(this->rtppacketbuilder);
          uVar1 = RTPPacketBuilder::GetPacketTimestamp(this->rtppacketbuilder);
          packetcount = RTPPacketBuilder::GetPacketCount(this->rtppacketbuilder);
          diff.m_t._4_4_ = RTPPacketBuilder::GetPayloadOctetCount(this->rtppacketbuilder);
          _rtptimestamp = rtppacktime.m_t;
          RTPTime::operator-=((RTPTime *)&rtptimestamp,(RTPTime *)&packcount);
          RTPTime::operator+=((RTPTime *)&rtptimestamp,&this->transmissiondelay);
          dVar4 = RTPTime::GetDouble((RTPTime *)&rtptimestamp);
          ntptimestamp.lsw = (uint32_t)(long)(dVar4 / this->timestampunit + 0.5);
          ntptimestamp.msw = uVar1 + ntptimestamp.lsw;
          owncname = (uint8_t *)RTPTime::GetNTPTime(&rtppacktime);
          iVar2 = RTCPCompoundPacketBuilder::StartSenderReport
                            (this_00,senderssrc,(RTPNTPTime *)&owncname,ntptimestamp.msw,packetcount
                             ,diff.m_t._4_4_);
          if (iVar2 < 0) {
            pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            if (iVar2 != -0x2b) {
              return iVar2;
            }
            return -0x33;
          }
        }
        owncnamelen = (size_t)RTCPSDESInfo::GetCNAME
                                        (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)&skipped)
        ;
        this_local._4_4_ = RTCPCompoundPacketBuilder::AddSDESSource(this_00,senderssrc);
        if (this_local._4_4_ < 0) {
          pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
          if (this_local._4_4_ == -0x2b) {
            this_local._4_4_ = -0x33;
          }
        }
        else {
          this_local._4_4_ =
               RTCPCompoundPacketBuilder::AddSDESNormalItem
                         (this_00,CNAME,(void *)owncnamelen,(uint8_t)skipped);
          if (this_local._4_4_ < 0) {
            pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            if (this_local._4_4_ == -0x2b) {
              this_local._4_4_ = -0x33;
            }
          }
          else {
            if ((this->processingsdes & 1U) == 0) {
              iVar2 = RTPSources::GetTotalCount(this->sources);
              iVar2 = FillInReportBlocks(this,this_00,&rtppacktime,iVar2,&atendoflist_1,
                                         &stack0xffffffffffffff6c,&itemcount,&processedall_1);
              if (iVar2 < 0) {
                pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                return iVar2;
              }
              if (((atendoflist_1 & 1U) != 0) && (iStack_94 == 0)) {
                pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                return -0x33;
              }
              if ((atendoflist_1 & 1U) == 0) {
                this->processingsdes = true;
                this->sdesbuildcount = this->sdesbuildcount + 1;
                ClearAllSourceFlags(this);
                this->doname = false;
                this->doemail = false;
                this->doloc = false;
                this->dophone = false;
                this->dotool = false;
                this->donote = false;
                if ((0 < this->interval_name) && (this->sdesbuildcount % this->interval_name == 0))
                {
                  this->doname = true;
                }
                if ((0 < this->interval_email) && (this->sdesbuildcount % this->interval_email == 0)
                   ) {
                  this->doemail = true;
                }
                if ((0 < this->interval_location) &&
                   (this->sdesbuildcount % this->interval_location == 0)) {
                  this->doloc = true;
                }
                if ((0 < this->interval_phone) && (this->sdesbuildcount % this->interval_phone == 0)
                   ) {
                  this->dophone = true;
                }
                if ((0 < this->interval_tool) && (this->sdesbuildcount % this->interval_tool == 0))
                {
                  this->dotool = true;
                }
                if ((0 < this->interval_note) && (this->sdesbuildcount % this->interval_note == 0))
                {
                  this->donote = true;
                }
                iVar2 = FillInSDES(this,this_00,&atendoflist_1,&local_9b,&itemcount_1);
                if (iVar2 < 0) {
                  pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                  RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                  return iVar2;
                }
                if ((local_9b & 1U) != 0) {
                  this->processingsdes = false;
                  ClearAllSDESFlags(this);
                  if ((((atendoflist_1 & 1U) == 0) && (0 < itemcount)) &&
                     (iVar2 = FillInReportBlocks(this,this_00,&rtppacktime,itemcount,&atendoflist_1,
                                                 &stack0xffffffffffffff6c,&itemcount,&full_1),
                     iVar2 < 0)) {
                    pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                    RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                    return iVar2;
                  }
                }
              }
            }
            else {
              iVar2 = FillInSDES(this,this_00,(bool *)((long)&skipped_1 + 3),&local_a2,&added_1);
              if (iVar2 < 0) {
                pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                return iVar2;
              }
              if (added_1 == 0) {
                pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                return -0x33;
              }
              if ((local_a2 & 1U) != 0) {
                this->processingsdes = false;
                ClearAllSDESFlags(this);
                if ((skipped_1._3_1_ & 1) == 0) {
                  iVar2 = RTPSources::GetTotalCount(this->sources);
                  iVar2 = FillInReportBlocks(this,this_00,&rtppacktime,iVar2,
                                             (bool *)((long)&skipped_1 + 3),
                                             (int *)&stack0xffffffffffffff50,&local_b4,&local_b5);
                  if (iVar2 < 0) {
                    pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                    RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
                    return iVar2;
                  }
                  if ((local_b5 & 1U) != 0) {
                    ClearAllSourceFlags(this);
                  }
                }
              }
            }
            this_local._4_4_ = RTCPCompoundPacketBuilder::EndBuild(this_00);
            if (this_local._4_4_ < 0) {
              pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
              RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            }
            else {
              *pack = (RTCPCompoundPacket *)this_00;
              this->firstpacket = false;
              (this->prevbuildtime).m_t = rtppacktime.m_t;
              this_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPPacketBuilder::BuildNextPacket(RTCPCompoundPacket **pack)
{
	if (!init)
		return ERR_RTP_RTCPPACKETBUILDER_NOTINIT;

	RTCPCompoundPacketBuilder *rtcpcomppack;
	int status;
	bool sender = false;
	RTPSourceData *srcdat;
	
	*pack = 0;
	
	rtcpcomppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPCOMPOUNDPACKETBUILDER) RTCPCompoundPacketBuilder(GetMemoryManager());
	if (rtcpcomppack == 0)
		return ERR_RTP_OUTOFMEM;
	
	if ((status = rtcpcomppack->InitBuild(maxpacketsize)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}
	
	if ((srcdat = sources.GetOwnSourceInfo()) != 0)
	{
		if (srcdat->IsSender())
			sender = true;
	}
	
	uint32_t ssrc = rtppacketbuilder.GetSSRC();
	RTPTime curtime = RTPTime::CurrentTime();

	if (sender)
	{
		RTPTime rtppacktime = rtppacketbuilder.GetPacketTime();
		uint32_t rtppacktimestamp = rtppacketbuilder.GetPacketTimestamp();
		uint32_t packcount = rtppacketbuilder.GetPacketCount();
		uint32_t octetcount = rtppacketbuilder.GetPayloadOctetCount();
		RTPTime diff = curtime;
		diff -= rtppacktime;
		diff += transmissiondelay; // the sample being sampled at this very instant will need a larger timestamp
		
		uint32_t tsdiff = (uint32_t)((diff.GetDouble()/timestampunit)+0.5);
		uint32_t rtptimestamp = rtppacktimestamp+tsdiff;
		RTPNTPTime ntptimestamp = curtime.GetNTPTime();

		if ((status = rtcpcomppack->StartSenderReport(ssrc,ntptimestamp,rtptimestamp,packcount,octetcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}
	else
	{
		if ((status = rtcpcomppack->StartReceiverReport(ssrc)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}

	uint8_t *owncname;
	size_t owncnamelen;

	owncname = ownsdesinfo.GetCNAME(&owncnamelen);

	if ((status = rtcpcomppack->AddSDESSource(ssrc)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}

	if (!processingsdes)
	{
		int added,skipped;
		bool full,atendoflist;

		if ((status = FillInReportBlocks(rtcpcomppack,curtime,sources.GetTotalCount(),&full,&added,&skipped,&atendoflist)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return status;
		}
		
		if (full && added == 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		}
	
		if (!full)
		{
			processingsdes = true;
			sdesbuildcount++;
			
			ClearAllSourceFlags();
	
			doname = false;
			doemail = false;
			doloc = false;
			dophone = false;
			dotool = false;
			donote = false;
			if (interval_name > 0 && ((sdesbuildcount%interval_name) == 0)) doname = true;
			if (interval_email > 0 && ((sdesbuildcount%interval_email) == 0)) doemail = true;
			if (interval_location > 0 && ((sdesbuildcount%interval_location) == 0)) doloc = true;
			if (interval_phone > 0 && ((sdesbuildcount%interval_phone) == 0)) dophone = true;
			if (interval_tool > 0 && ((sdesbuildcount%interval_tool) == 0)) dotool = true;
			if (interval_note > 0 && ((sdesbuildcount%interval_note) == 0)) donote = true;
			
			bool processedall;
			int itemcount;
			
			if ((status = FillInSDES(rtcpcomppack,&full,&processedall,&itemcount)) < 0)
			{
				RTPDelete(rtcpcomppack,GetMemoryManager());
				return status;
			}

			if (processedall)
			{
				processingsdes = false;
				ClearAllSDESFlags();
				if (!full && skipped > 0) 
				{
					// if the packet isn't full and we skipped some
				        // sources that we already got in a previous packet,
					// we can add some of them now
					
					bool atendoflist;
					 
					if ((status = FillInReportBlocks(rtcpcomppack,curtime,skipped,&full,&added,&skipped,&atendoflist)) < 0)
					{
						RTPDelete(rtcpcomppack,GetMemoryManager());
						return status;
					}
				}
			}
		}
	}
	else // previous sdes processing wasn't finished
	{
		bool processedall;
		int itemcount;
		bool full;
			
		if ((status = FillInSDES(rtcpcomppack,&full,&processedall,&itemcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return status;
		}

		if (itemcount == 0) // Big problem: packet size is too small to let any progress happen
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		}

		if (processedall)
		{
			processingsdes = false;
			ClearAllSDESFlags();
			if (!full) 
			{
				// if the packet isn't full and we skipped some
				// we can add some report blocks
				
				int added,skipped;
				bool atendoflist;

				if ((status = FillInReportBlocks(rtcpcomppack,curtime,sources.GetTotalCount(),&full,&added,&skipped,&atendoflist)) < 0)
				{
					RTPDelete(rtcpcomppack,GetMemoryManager());
					return status;
				}
				if (atendoflist) // filled in all possible sources
					ClearAllSourceFlags();
			}
		}
	}
		
	if ((status = rtcpcomppack->EndBuild()) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}

	*pack = rtcpcomppack;
	firstpacket = false;
	prevbuildtime = curtime;
	return 0;
}